

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::FileGenerator::FileGenerator
          (FileGenerator *this,FileDescriptor *file,Options *options,bool immutable_api)

{
  ulong uVar1;
  pointer pcVar2;
  ImmutableGeneratorFactory *pIVar3;
  GeneratorFactory *pGVar4;
  MessageGenerator *pMVar5;
  ExtensionGenerator *pEVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  long *plVar11;
  Context *this_00;
  ClassNameResolver *pCVar12;
  ImmutableGeneratorFactory *this_01;
  scoped_ptr<google::protobuf::compiler::java::MessageGenerator> *psVar13;
  undefined4 extraout_var;
  FileDescriptor *pFVar14;
  scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator> *psVar15;
  undefined4 extraout_var_00;
  undefined7 in_register_00000009;
  ulong uVar16;
  long lVar17;
  long lVar18;
  string local_50;
  
  this->file_ = file;
  FileJavaPackage_abi_cxx11_
            (&this->java_package_,(java *)file,
             (FileDescriptor *)(CONCAT71(in_register_00000009,immutable_api) & 0xffffffff),
             immutable_api);
  (this->classname_)._M_dataplus._M_p = (pointer)&(this->classname_).field_2;
  (this->classname_)._M_string_length = 0;
  (this->classname_).field_2._M_local_buf[0] = '\0';
  iVar10 = *(int *)(file + 0x58);
  lVar17 = (long)iVar10;
  uVar1 = lVar17 * 8;
  uVar16 = uVar1 + 8;
  if (0xfffffffffffffff7 < uVar1) {
    uVar16 = 0xffffffffffffffff;
  }
  if (lVar17 < 0) {
    uVar16 = 0xffffffffffffffff;
  }
  plVar11 = (long *)operator_new__(uVar16);
  *plVar11 = lVar17;
  if (iVar10 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::java::MessageGenerator> *)(plVar11 + 1),0,uVar1);
  }
  (this->message_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::java::MessageGenerator> *)(plVar11 + 1);
  iVar10 = *(int *)(file + 0x88);
  lVar17 = (long)iVar10;
  uVar1 = lVar17 * 8;
  uVar16 = uVar1 + 8;
  if (0xfffffffffffffff7 < uVar1) {
    uVar16 = 0xffffffffffffffff;
  }
  if (lVar17 < 0) {
    uVar16 = 0xffffffffffffffff;
  }
  plVar11 = (long *)operator_new__(uVar16);
  *plVar11 = lVar17;
  if (iVar10 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator> *)(plVar11 + 1),0,uVar1
          );
  }
  (this->extension_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator> *)(plVar11 + 1);
  (this->generator_factory_).ptr_ = (GeneratorFactory *)0x0;
  this_00 = (Context *)operator_new(0xb0);
  Context::Context(this_00,file,options);
  (this->context_).ptr_ = this_00;
  pCVar12 = Context::GetNameResolver(this_00);
  this->name_resolver_ = pCVar12;
  bVar7 = options->generate_mutable_code;
  bVar8 = options->generate_shared_code;
  bVar9 = options->enforce_lite;
  (this->options_).generate_immutable_code = options->generate_immutable_code;
  (this->options_).generate_mutable_code = bVar7;
  (this->options_).generate_shared_code = bVar8;
  (this->options_).enforce_lite = bVar9;
  (this->options_).annotate_code = options->annotate_code;
  (this->options_).annotation_list_file._M_dataplus._M_p =
       (pointer)&(this->options_).annotation_list_file.field_2;
  pcVar2 = (options->annotation_list_file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options_).annotation_list_file,pcVar2,
             pcVar2 + (options->annotation_list_file)._M_string_length);
  (this->options_).output_list_file._M_dataplus._M_p =
       (pointer)&(this->options_).output_list_file.field_2;
  pcVar2 = (options->output_list_file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options_).output_list_file,pcVar2,
             pcVar2 + (options->output_list_file)._M_string_length);
  this->immutable_api_ = immutable_api;
  ClassNameResolver::GetFileClassName_abi_cxx11_(&local_50,this->name_resolver_,file,immutable_api);
  std::__cxx11::string::operator=((string *)&this->classname_,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this_01 = (ImmutableGeneratorFactory *)operator_new(0x10);
  ImmutableGeneratorFactory::ImmutableGeneratorFactory(this_01,(this->context_).ptr_);
  pIVar3 = (ImmutableGeneratorFactory *)(this->generator_factory_).ptr_;
  if (pIVar3 != this_01) {
    if (pIVar3 != (ImmutableGeneratorFactory *)0x0) {
      (*(pIVar3->super_GeneratorFactory)._vptr_GeneratorFactory[1])();
    }
    (this->generator_factory_).ptr_ = (GeneratorFactory *)this_01;
  }
  pFVar14 = this->file_;
  if (0 < *(int *)(pFVar14 + 0x58)) {
    lVar18 = 0;
    lVar17 = 0;
    do {
      psVar13 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
                ::operator[](&this->message_generators_,lVar17);
      pGVar4 = (this->generator_factory_).ptr_;
      if (pGVar4 == (GeneratorFactory *)0x0) goto LAB_00269dea;
      iVar10 = (*pGVar4->_vptr_GeneratorFactory[2])(pGVar4,*(long *)(this->file_ + 0x60) + lVar18);
      pMVar5 = psVar13->ptr_;
      if (pMVar5 != (MessageGenerator *)CONCAT44(extraout_var,iVar10)) {
        if (pMVar5 != (MessageGenerator *)0x0) {
          (*pMVar5->_vptr_MessageGenerator[1])();
        }
        psVar13->ptr_ = (MessageGenerator *)CONCAT44(extraout_var,iVar10);
      }
      lVar17 = lVar17 + 1;
      pFVar14 = this->file_;
      lVar18 = lVar18 + 0xa8;
    } while (lVar17 < *(int *)(pFVar14 + 0x58));
  }
  if (0 < *(int *)(pFVar14 + 0x88)) {
    lVar18 = 0;
    lVar17 = 0;
    do {
      psVar15 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>_>
                ::operator[](&this->extension_generators_,lVar17);
      pGVar4 = (this->generator_factory_).ptr_;
      if (pGVar4 == (GeneratorFactory *)0x0) {
LAB_00269dea:
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                      ,0x5f,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::GeneratorFactory>::operator->() const [C = google::protobuf::compiler::java::GeneratorFactory]"
                     );
      }
      iVar10 = (*pGVar4->_vptr_GeneratorFactory[3])(pGVar4,*(long *)(this->file_ + 0x98) + lVar18);
      pEVar6 = psVar15->ptr_;
      if (pEVar6 != (ExtensionGenerator *)CONCAT44(extraout_var_00,iVar10)) {
        if (pEVar6 != (ExtensionGenerator *)0x0) {
          (*pEVar6->_vptr_ExtensionGenerator[1])();
        }
        psVar15->ptr_ = (ExtensionGenerator *)CONCAT44(extraout_var_00,iVar10);
      }
      lVar17 = lVar17 + 1;
      lVar18 = lVar18 + 0xa8;
    } while (lVar17 < *(int *)(this->file_ + 0x88));
  }
  return;
}

Assistant:

FileGenerator::FileGenerator(const FileDescriptor* file, const Options& options,
                             bool immutable_api)
    : file_(file),
      java_package_(FileJavaPackage(file, immutable_api)),
      message_generators_(
          new google::protobuf::scoped_ptr<MessageGenerator>[file->message_type_count()]),
      extension_generators_(
          new google::protobuf::scoped_ptr<ExtensionGenerator>[file->extension_count()]),
      context_(new Context(file, options)),
      name_resolver_(context_->GetNameResolver()),
      options_(options),
      immutable_api_(immutable_api) {
  classname_ = name_resolver_->GetFileClassName(file, immutable_api);
  generator_factory_.reset(
      new ImmutableGeneratorFactory(context_.get()));
  for (int i = 0; i < file_->message_type_count(); ++i) {
    message_generators_[i].reset(
        generator_factory_->NewMessageGenerator(file_->message_type(i)));
  }
  for (int i = 0; i < file_->extension_count(); ++i) {
    extension_generators_[i].reset(
        generator_factory_->NewExtensionGenerator(file_->extension(i)));
  }
}